

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O1

void __thiscall ev3dev::remote_control::on_value_changed(remote_control *this,int value)

{
  uint uVar1;
  bool local_19;
  bool local_18;
  bool local_17;
  bool local_16;
  bool local_15;
  uint local_14;
  
  uVar1 = 0;
  if (value - 1U < 0xb) {
    uVar1 = *(uint *)(&DAT_0011566c + (ulong)(value - 1U) * 4);
  }
  if (((uVar1 & 1) != (this->_state & 1U)) &&
     ((this->on_red_up).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_19 = SUB41(uVar1 & 1,0);
    (*(this->on_red_up)._M_invoker)((_Any_data *)&this->on_red_up,&local_19);
  }
  if (((uVar1 & 2) != (this->_state & 2U)) &&
     ((this->on_red_down).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_18 = SUB41((uVar1 & 2) >> 1,0);
    (*(this->on_red_down)._M_invoker)((_Any_data *)&this->on_red_down,&local_18);
  }
  if (((uVar1 & 4) != (this->_state & 4U)) &&
     ((this->on_blue_up).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_17 = SUB41((uVar1 & 4) >> 2,0);
    (*(this->on_blue_up)._M_invoker)((_Any_data *)&this->on_blue_up,&local_17);
  }
  if (((uVar1 & 8) != (this->_state & 8U)) &&
     ((this->on_blue_down).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_16 = SUB41((uVar1 & 8) >> 3,0);
    (*(this->on_blue_down)._M_invoker)((_Any_data *)&this->on_blue_down,&local_16);
  }
  if ((((this->_state ^ uVar1) & 0x10) != 0) &&
     ((this->on_beacon).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_15 = SUB41(uVar1 >> 4,0);
    (*(this->on_beacon)._M_invoker)((_Any_data *)&this->on_beacon,&local_15);
  }
  if ((uVar1 != this->_state) &&
     ((this->on_state_change).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_14 = uVar1;
    (*(this->on_state_change)._M_invoker)((_Any_data *)&this->on_state_change,(int *)&local_14);
  }
  this->_state = uVar1;
  return;
}

Assistant:

void remote_control::on_value_changed(int value) {
    int new_state = 0;

    switch (value) {
        case 1:
            new_state = red_up;
            break;
        case 2:
            new_state = red_down;
            break;
        case 3:
            new_state = blue_up;
            break;
        case  4:
            new_state = blue_down;
            break;
        case 5:
            new_state = red_up | blue_up;
            break;
        case 6:
            new_state = red_up | blue_down;
            break;
        case 7:
            new_state = red_down |  blue_up;
            break;
        case 8:
            new_state = red_down | blue_down;
            break;
        case 9:
            new_state = beacon;
            break;
        case 10:
            new_state = red_up | red_down;
            break;
        case 11:
            new_state = blue_up | blue_down;
            break;
    }

    if (((new_state & red_up) != (_state & red_up)) &&
            static_cast<bool>(on_red_up))
        on_red_up(new_state & red_up);

    if (((new_state & red_down) != (_state & red_down)) &&
            static_cast<bool>(on_red_down))
        on_red_down(new_state & red_down);

    if (((new_state & blue_up) != (_state & blue_up)) &&
            static_cast<bool>(on_blue_up))
        on_blue_up(new_state & blue_up);

    if (((new_state & blue_down) != (_state & blue_down)) &&
            static_cast<bool>(on_blue_down))
        on_blue_down(new_state & blue_down);

    if (((new_state & beacon) != (_state & beacon)) &&
            static_cast<bool>(on_beacon))
        on_beacon(new_state & beacon);

    if ((new_state != _state) &&
            static_cast<bool>(on_state_change))
        on_state_change(new_state);

    _state = new_state;
}